

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O1

int Aig_ManScanMapping_rec(Cnf_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vMapped)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  ulong uVar7;
  Aig_Obj_t *pObj_00;
  long lVar8;
  void *pvVar9;
  
  uVar7 = *(ulong *)&pObj->field_0x18;
  *(ulong *)&pObj->field_0x18 =
       uVar7 & 0xffffffff0000003f | (ulong)((uint)uVar7 + 0x40 & 0xffffffc0);
  if ((uVar7 & 0xffffffc0) != 0) {
    return 0;
  }
  uVar2 = (uint)uVar7 & 7;
  if (uVar2 == 2) {
    return 0;
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  if (uVar2 == 1) {
    return 0;
  }
  if (uVar2 != 5) {
    __assert_fail("Aig_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfUtil.c"
                  ,0x35,"int Aig_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (vMapped == (Vec_Ptr_t *)0x0) goto LAB_00502182;
  uVar2 = vMapped->nCap;
  if (vMapped->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vMapped->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vMapped->pArray,0x80);
      }
      vMapped->pArray = ppvVar4;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_00502170;
      if (vMapped->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vMapped->pArray,(ulong)uVar2 << 4);
      }
      vMapped->pArray = ppvVar4;
    }
    vMapped->nCap = iVar6;
  }
LAB_00502170:
  iVar6 = vMapped->nSize;
  vMapped->nSize = iVar6 + 1;
  vMapped->pArray[iVar6] = pObj;
LAB_00502182:
  if ((pObj->field_0x18 & 0x20) == 0) {
    pvVar9 = (pObj->field_5).pData;
    uVar2 = *(uint *)((long)pvVar9 + 4);
    while ((~uVar2 & 0x18000000) != 0) {
      puVar1 = (uint *)((long)pvVar9 + 0x1c);
      pvVar9 = (void *)((long)pvVar9 + 0x18);
      uVar2 = *puVar1;
    }
    uVar7 = (ulong)*(uint *)((long)pvVar9 + 4) & 0xffff;
    iVar6 = (int)p->pSopSizes[uVar7 ^ 0xffff] + (int)p->pSopSizes[uVar7];
    if (0x1fffffff < *(uint *)((long)pvVar9 + 4)) {
      uVar7 = 0;
      do {
        pVVar5 = p->pManAig->vObjs;
        if (pVVar5 == (Vec_Ptr_t *)0x0) {
          pObj_00 = (Aig_Obj_t *)0x0;
        }
        else {
          uVar2 = *(uint *)((long)pvVar9 + uVar7 * 4 + 8);
          if (((int)uVar2 < 0) || (pVVar5->nSize <= (int)uVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pObj_00 = (Aig_Obj_t *)pVVar5->pArray[uVar2];
        }
        iVar3 = Aig_ManScanMapping_rec(p,pObj_00,vMapped);
        iVar6 = iVar6 + iVar3;
        uVar7 = uVar7 + 1;
      } while (uVar7 < *(uint *)((long)pvVar9 + 4) >> 0x1d);
    }
  }
  else {
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    pVVar5->pArray = ppvVar4;
    Aig_ObjCollectSuper(pObj,pVVar5);
    iVar6 = pVVar5->nSize + 1;
    if (0 < pVVar5->nSize) {
      lVar8 = 0;
      do {
        iVar3 = Aig_ManScanMapping_rec
                          (p,(Aig_Obj_t *)((ulong)pVVar5->pArray[lVar8] & 0xfffffffffffffffe),
                           vMapped);
        iVar6 = iVar6 + iVar3;
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar5->nSize);
    }
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (void **)0x0;
    }
    free(pVVar5);
    pObj->field_0x18 = pObj->field_0x18 | 0x20;
  }
  return iVar6;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes area, references, and nodes used in the mapping.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManScanMapping_rec( Cnf_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vMapped )
{
    Aig_Obj_t * pLeaf;
    Dar_Cut_t * pCutBest;
    int aArea, i;
    if ( pObj->nRefs++ || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return 0;
    assert( Aig_ObjIsAnd(pObj) );
    // collect the node first to derive pre-order
    if ( vMapped )
        Vec_PtrPush( vMapped, pObj );
    // visit the transitive fanin of the selected cut
    if ( pObj->fMarkB )
    {
        Vec_Ptr_t * vSuper = Vec_PtrAlloc( 100 );
        Aig_ObjCollectSuper( pObj, vSuper );
        aArea = Vec_PtrSize(vSuper) + 1;
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pLeaf, i )
            aArea += Aig_ManScanMapping_rec( p, Aig_Regular(pLeaf), vMapped );
        Vec_PtrFree( vSuper );
        ////////////////////////////
        pObj->fMarkB = 1;
    }
    else
    {
        pCutBest = Dar_ObjBestCut( pObj );
        aArea = Cnf_CutSopCost( p, pCutBest );
        Dar_CutForEachLeaf( p->pManAig, pCutBest, pLeaf, i )
            aArea += Aig_ManScanMapping_rec( p, pLeaf, vMapped );
    }
    return aArea;
}